

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

VarId refill(map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             *redundantphi,VarId *name)

{
  _Rb_tree_color _Var1;
  long in_RDX;
  undefined **ppuVar2;
  uint32_t *puVar3;
  VarId VVar4;
  
  puVar3 = (uint32_t *)name[1].super_Displayable._vptr_Displayable;
  _Var1 = *(_Rb_tree_color *)(in_RDX + 8);
  if (puVar3 != (uint32_t *)0x0) {
    ppuVar2 = (undefined **)&name->id;
    do {
      if (puVar3[10] >= _Var1) {
        ppuVar2 = (undefined **)puVar3;
      }
      puVar3 = *(uint32_t **)(puVar3 + (ulong)(puVar3[10] < _Var1) * 2 + 4);
    } while (puVar3 != (uint32_t *)0x0);
    if ((ppuVar2 != (undefined **)&name->id) && (*(_Rb_tree_color *)((long)ppuVar2 + 0x28) <= _Var1)
       ) {
      *(undefined ***)&(redundantphi->_M_t)._M_impl = &PTR_display_001eb100;
      _Var1 = *(_Rb_tree_color *)((long)ppuVar2 + 0x38);
      goto LAB_0019548e;
    }
  }
  ppuVar2 = &PTR_display_001eb100;
  *(undefined ***)&(redundantphi->_M_t)._M_impl = &PTR_display_001eb100;
LAB_0019548e:
  (redundantphi->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var1;
  VVar4._8_8_ = ppuVar2;
  VVar4.super_Displayable._vptr_Displayable = (_func_int **)redundantphi;
  return VVar4;
}

Assistant:

mir::inst::VarId refill(map<mir::inst::VarId, mir::inst::VarId> redundantphi,
                        mir::inst::VarId name) {
  map<mir::inst::VarId, mir::inst::VarId>::iterator it =
      redundantphi.find(name);
  if (it == redundantphi.end()) {
    return name;
  } else {
    return it->second;
  }
}